

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_nws_image.cc
# Opt level: O2

void __thiscall
NWSImageHandler::NWSImageHandler
          (NWSImageHandler *this,Handler *config,shared_ptr<FileWriter> *fileWriter)

{
  (this->super_Handler)._vptr_Handler = (_func_int **)&PTR_handle_001f4130;
  Config::Handler::Handler(&this->config_,config);
  std::__shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->fileWriter_).super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>,
             &fileWriter->super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

NWSImageHandler::NWSImageHandler(
  const Config::Handler& config,
  const std::shared_ptr<FileWriter>& fileWriter)
  : config_(config),
    fileWriter_(fileWriter) {
}